

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_renormd(opj_mqc_t *mqc)

{
  opj_mqc_t *in_RDI;
  
  do {
    if (in_RDI->ct == 0) {
      mqc_bytein(in_RDI);
    }
    in_RDI->a = in_RDI->a << 1;
    in_RDI->c = in_RDI->c << 1;
    in_RDI->ct = in_RDI->ct - 1;
  } while (in_RDI->a < 0x8000);
  return;
}

Assistant:

static INLINE void mqc_renormd(opj_mqc_t *const mqc) {
	do {
		if (mqc->ct == 0) {
			mqc_bytein(mqc);
		}
		mqc->a <<= 1;
		mqc->c <<= 1;
		mqc->ct--;
	} while (mqc->a < 0x8000);
}